

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  ExpressionType EVar1;
  reference result_00;
  const_reference this_00;
  type expr_00;
  reference pvVar2;
  InternalException *this_01;
  size_type __n;
  Vector intermediate;
  string local_d0;
  LogicalType local_b0;
  Vector local_98;
  
  DataChunk::Reset(&state->intermediate_chunk);
  if ((expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      result_00 = vector<duckdb::Vector,_true>::operator[](&(state->intermediate_chunk).data,__n);
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&expr->children,__n);
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_00);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state->child_states,__n);
      Execute(this,expr_00,
              (pvVar2->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
              result_00);
      if (__n == 0) {
        Vector::Reference(result,result_00);
      }
      else {
        LogicalType::LogicalType(&local_b0,BOOLEAN);
        Vector::Vector(&local_98,&local_b0,0x800);
        LogicalType::~LogicalType(&local_b0);
        EVar1 = (expr->super_Expression).super_BaseExpression.type;
        if (EVar1 == CONJUNCTION_AND) {
          VectorOperations::And(result_00,result,&local_98,count);
        }
        else {
          if (EVar1 != CONJUNCTION_OR) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"Unknown conjunction type!","");
            InternalException::InternalException(this_01,&local_d0);
            __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          VectorOperations::Or(result_00,result,&local_98,count);
        }
        Vector::Reference(result,&local_98);
        if (local_98.auxiliary.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.auxiliary.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.buffer.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.buffer.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        LogicalType::~LogicalType(&local_98.type);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(expr->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expr->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundConjunctionExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// execute the children
	state->intermediate_chunk.Reset();
	for (idx_t i = 0; i < expr.children.size(); i++) {
		auto &current_result = state->intermediate_chunk.data[i];
		Execute(*expr.children[i], state->child_states[i].get(), sel, count, current_result);
		if (i == 0) {
			// move the result
			result.Reference(current_result);
		} else {
			Vector intermediate(LogicalType::BOOLEAN);
			// AND/OR together
			switch (expr.GetExpressionType()) {
			case ExpressionType::CONJUNCTION_AND:
				VectorOperations::And(current_result, result, intermediate, count);
				break;
			case ExpressionType::CONJUNCTION_OR:
				VectorOperations::Or(current_result, result, intermediate, count);
				break;
			default:
				throw InternalException("Unknown conjunction type!");
			}
			result.Reference(intermediate);
		}
	}
}